

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

string * flatbuffers::kotlin::KotlinGenerator::Indirect
                   (string *__return_storage_ptr__,string *index,bool fixed)

{
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((int)CONCAT71(in_register_00000011,fixed) == 0) {
    std::operator+(&local_30,"__indirect(",index);
    std::operator+(__return_storage_ptr__,&local_30,")");
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)index);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Indirect(const std::string &index, bool fixed) {
    // We apply __indirect() and struct is not fixed.
    if (!fixed) return "__indirect(" + index + ")";
    return index;
  }